

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semicircle.hpp
# Opt level: O1

bool __thiscall
boost::geometry::model::
semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>::
intersects_box<boost::geometry::model::box<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
          (semicircle<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>
           *this,box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_> *b
          )

{
  bool bVar1;
  bool bVar2;
  segment_point_type p0;
  segment<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_> local_48;
  point<double,_2UL,_boost::geometry::cs::cartesian> local_28;
  
  local_48.
  super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
  .first.m_values[0] = *(double *)this;
  local_48.
  super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
  .first.m_values[1] = *(double *)(this + 8);
  local_28.m_values[0] = *(double *)(this + 0x10);
  local_28.m_values[1] = *(double *)(this + 0x18);
  bVar1 = strategy::disjoint::detail::
          disjoint_segment_box_impl<double,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::box<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>,_0UL,_2UL>
          ::apply((point<double,_2UL,_boost::geometry::cs::cartesian> *)&local_48,&local_28,b);
  bVar2 = true;
  if (bVar1) {
    local_48.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .second.m_values[0] = (b->m_min_corner).m_values[0];
    local_48.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .second.m_values[1] = (b->m_max_corner).m_values[1];
    local_48.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .first.m_values[0] = (b->m_min_corner).m_values[0];
    local_48.
    super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
    .first.m_values[1] = (b->m_min_corner).m_values[1];
    bVar1 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                      (this,&local_48);
    bVar2 = true;
    if (!bVar1) {
      local_48.
      super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
      .first.m_values[0] = (b->m_max_corner).m_values[0];
      local_48.
      super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
      .first.m_values[1] = (b->m_max_corner).m_values[1];
      bVar1 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                        (this,&local_48);
      if (!bVar1) {
        local_48.
        super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
        .second.m_values[0] = (b->m_max_corner).m_values[0];
        local_48.
        super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
        .second.m_values[1] = (b->m_min_corner).m_values[1];
        bVar1 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                          (this,&local_48);
        if (!bVar1) {
          local_48.
          super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
          .first.m_values[0] = (b->m_min_corner).m_values[0];
          local_48.
          super_pair<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>
          .first.m_values[1] = (b->m_min_corner).m_values[1];
          bVar2 = intersects_segment<boost::geometry::model::segment<boost::geometry::model::point<double,2ul,boost::geometry::cs::cartesian>>>
                            (this,&local_48);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool intersects_box(Box const &b) const
    {
        if (geometry::intersects(s, b))
            return true;
        typedef typename point_type<Box>::type BoxPoint;
        typedef segment<BoxPoint> BoxSegment;
        BoxSegment bs(b.min_corner(),
                        BoxPoint(get<min_corner, 0>(b), get<max_corner, 1>(b)));
        if (intersects_segment(bs))
            return true;
        bs.first = b.max_corner();
        if (intersects_segment(bs))
            return true;
        set<0>(bs.second, get<max_corner, 0>(b));
        set<1>(bs.second, get<min_corner, 1>(b));
        if (intersects_segment(bs))
            return true;
        bs.first = b.min_corner();
        if (intersects_segment(bs))
            return true;
        return false;
    }